

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_teleportother.cpp
# Opt level: O2

int AF_A_CheckTeleRing(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  int iVar2;
  DObject *this;
  bool bVar3;
  FState *newstate;
  AActor *this_00;
  char *__assertion;
  FName local_1c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00544994;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_005448d5:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00544994;
        }
      }
      if (numparam == 1) goto LAB_00544946;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_00544984;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00544994;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_00544984;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00544946:
        iVar2 = this_00->special1;
        this_00->special1 = iVar2 + -1;
        if (iVar2 < 1) {
          local_1c.Index = 0x87;
          newstate = AActor::FindState(this_00,&local_1c);
          AActor::SetState(this_00,newstate,false);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00544994;
    }
    if (this_00 == (AActor *)0x0) goto LAB_005448d5;
  }
LAB_00544984:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00544994:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_teleportother.cpp"
                ,0x5e,"int AF_A_CheckTeleRing(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CheckTeleRing)
{
	PARAM_ACTION_PROLOGUE;

	if (self->special1-- <= 0)
	{
		self->SetState (self->FindState(NAME_Death));
	}
	return 0;
}